

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie_test.cc
# Opt level: O0

int main(void)

{
  basic_test();
  skew_basic_test();
  hbtrie_reverse_iterator_test();
  hbtrie_partial_update_test();
  iterator_start_key_greater_than_prefix_test();
  initial_load_test_single_common_prefix();
  initial_load_test_nested_common_prefix();
  initial_load_test_tailing_null();
  initial_load_test_incremental_prefix();
  return 0;
}

Assistant:

int main(){
#ifdef _MEMPOOL
    mempool_init();
#endif

    //hbtrie_key_test();
    basic_test();
    skew_basic_test();
    hbtrie_reverse_iterator_test();
    hbtrie_partial_update_test();
    iterator_start_key_greater_than_prefix_test();
    //large_test();
    initial_load_test_single_common_prefix();
    initial_load_test_nested_common_prefix();
    initial_load_test_tailing_null();
    initial_load_test_incremental_prefix();

    return 0;
}